

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# os.h
# Opt level: O0

size_t mp::internal::ConvertFileToMmapSize(LongLong file_size,CStringRef filename)

{
  size_t in_RDI;
  size_t size;
  ULongLong unsigned_file_size;
  
  return in_RDI;
}

Assistant:

inline std::size_t ConvertFileToMmapSize(fmt::LongLong file_size,
                                         fmt::CStringRef filename) {
  MP_ASSERT(file_size >= 0, "negative file size");
  fmt::ULongLong unsigned_file_size = file_size;
  // Check if file size fits in size_t.
  std::size_t size = static_cast<std::size_t>(unsigned_file_size);
  if (size != unsigned_file_size)
    throw Error("file {} is too big", filename);
  return size;
}